

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O1

Expression * __thiscall
soul::HEARTGenerator::getAsReference(HEARTGenerator *this,Expression *e,bool isConstRef)

{
  Expression *pEVar1;
  StructMemberRef *member;
  Expression *pEVar2;
  ArrayElementRef *subscript;
  ArrayElement *unaff_R15;
  bool bVar3;
  CompileMessage local_60;
  
  bVar3 = false;
  pEVar1 = (Expression *)__dynamic_cast(e,&AST::Expression::typeinfo,&AST::VariableRef::typeinfo,0);
  if (pEVar1 != (Expression *)0x0) {
    unaff_R15 = (ArrayElement *)pEVar1[1].super_Statement.super_ASTObject._vptr_ASTObject[0xe];
    bVar3 = unaff_R15 != (ArrayElement *)0x0;
    if (isConstRef && !bVar3) {
      unaff_R15 = (ArrayElement *)evaluateAsConstantExpression(this,pEVar1);
      bVar3 = true;
    }
  }
  if (!bVar3) {
    member = (StructMemberRef *)
             __dynamic_cast(e,&AST::Expression::typeinfo,&AST::StructMemberRef::typeinfo,0);
    if (member == (StructMemberRef *)0x0) {
      subscript = (ArrayElementRef *)
                  __dynamic_cast(e,&AST::Expression::typeinfo,&AST::ArrayElementRef::typeinfo,0);
      if (subscript != (ArrayElementRef *)0x0) {
        pEVar1 = (subscript->object).object;
        if (pEVar1 == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator*",0x3b);
        }
        pEVar2 = getAsReference(this,pEVar1,isConstRef);
        unaff_R15 = createArraySubElement(this,subscript,pEVar2);
      }
      if (subscript == (ArrayElementRef *)0x0) {
        if (!isConstRef) {
          CompileMessageHelpers::createMessage<>
                    (&local_60,syntax,error,
                     "This expression cannot be used as the target for an assignment");
          AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_60,false);
        }
        pEVar2 = getExpressionAsMutableLocalCopy(this,e);
        return pEVar2;
      }
    }
    else {
      pEVar2 = getAsReference(this,(member->object).object,isConstRef);
      unaff_R15 = (ArrayElement *)createStructSubElement(this,member,pEVar2);
    }
  }
  return &unaff_R15->super_Expression;
}

Assistant:

heart::Expression& getAsReference (AST::Expression& e, bool isConstRef)
    {
        if (auto v = cast<AST::VariableRef> (e))
        {
            if (v->variable->generatedVariable != nullptr)
                return v->variable->getGeneratedVariable();

            if (isConstRef)
                return evaluateAsConstantExpression (*v);
        }

        if (auto member = cast<AST::StructMemberRef> (e))
            return createStructSubElement (*member, getAsReference (member->object, isConstRef));

        if (auto subscript = cast<AST::ArrayElementRef> (e))
            return createArraySubElement (*subscript, getAsReference (*subscript->object, isConstRef));

        if (isConstRef)
            return getExpressionAsMutableLocalCopy (e);

        e.context.throwError (Errors::expressionNotAssignable());
    }